

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

int gej_xyz_equals_gej(secp256k1_gej *a,secp256k1_gej *b)

{
  int iVar1;
  uint uVar2;
  void *in_RSI;
  void *in_RDI;
  int ret;
  secp256k1_gej b2;
  secp256k1_gej a2;
  undefined4 in_stack_fffffffffffffeb8;
  secp256k1_fe *in_stack_fffffffffffffec0;
  undefined1 local_a8 [152];
  void *local_10;
  
  uVar2 = (uint)(*(int *)((long)in_RDI + 0x90) == *(int *)((long)in_RSI + 0x90));
  if ((uVar2 != 0) && (*(int *)((long)in_RDI + 0x90) == 0)) {
    local_10 = in_RSI;
    memcpy(local_a8,in_RDI,0x98);
    memcpy(&stack0xfffffffffffffec0,local_10,0x98);
    secp256k1_fe_normalize((secp256k1_fe *)0x1499d9);
    secp256k1_fe_normalize((secp256k1_fe *)0x1499ea);
    secp256k1_fe_normalize((secp256k1_fe *)0x1499fb);
    secp256k1_fe_normalize((secp256k1_fe *)0x149a05);
    secp256k1_fe_normalize((secp256k1_fe *)0x149a13);
    secp256k1_fe_normalize((secp256k1_fe *)0x149a21);
    iVar1 = secp256k1_fe_cmp_var
                      (in_stack_fffffffffffffec0,
                       (secp256k1_fe *)CONCAT44(uVar2,in_stack_fffffffffffffeb8));
    uVar2 = iVar1 == 0 & uVar2;
    iVar1 = secp256k1_fe_cmp_var
                      (in_stack_fffffffffffffec0,
                       (secp256k1_fe *)CONCAT44(uVar2,in_stack_fffffffffffffeb8));
    uVar2 = iVar1 == 0 & uVar2;
    iVar1 = secp256k1_fe_cmp_var
                      (in_stack_fffffffffffffec0,
                       (secp256k1_fe *)CONCAT44(uVar2,in_stack_fffffffffffffeb8));
    uVar2 = iVar1 == 0 & uVar2;
  }
  return uVar2;
}

Assistant:

static int gej_xyz_equals_gej(const secp256k1_gej *a, const secp256k1_gej *b) {
    secp256k1_gej a2;
    secp256k1_gej b2;
    int ret = 1;
    ret &= a->infinity == b->infinity;
    if (ret && !a->infinity) {
        a2 = *a;
        b2 = *b;
        secp256k1_fe_normalize(&a2.x);
        secp256k1_fe_normalize(&a2.y);
        secp256k1_fe_normalize(&a2.z);
        secp256k1_fe_normalize(&b2.x);
        secp256k1_fe_normalize(&b2.y);
        secp256k1_fe_normalize(&b2.z);
        ret &= secp256k1_fe_cmp_var(&a2.x, &b2.x) == 0;
        ret &= secp256k1_fe_cmp_var(&a2.y, &b2.y) == 0;
        ret &= secp256k1_fe_cmp_var(&a2.z, &b2.z) == 0;
    }
    return ret;
}